

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglwindow.cpp
# Opt level: O2

void __thiscall QOpenGLWindowPrivate::beginPaint(QOpenGLWindowPrivate *this,QRegion *region)

{
  QWindow *this_00;
  QOpenGLWindowPaintDevice *this_01;
  int iVar1;
  int iVar2;
  GLuint framebuffer;
  QSize QVar3;
  QOpenGLFramebufferObject *pQVar4;
  long *plVar5;
  QOpenGLFunctions *this_02;
  sockaddr *__addr;
  long in_FS_OFFSET;
  double dVar6;
  double dVar7;
  socklen_t __len;
  qreal devicePixelRatio;
  QSize local_68;
  undefined1 auStack_60 [12];
  undefined4 local_54;
  char *local_50;
  QOpenGLFramebufferObjectFormat fboFormat;
  QSize local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWindow **)&this->field_0x8;
  initialize(this);
  QOpenGLContext::makeCurrent((QSurface *)(this->context).d);
  iVar1 = QWindow::width(this_00);
  dVar6 = (double)QWindow::devicePixelRatio();
  iVar2 = QWindow::height(this_00);
  dVar7 = (double)QWindow::devicePixelRatio();
  iVar1 = (int)(dVar6 * (double)iVar1);
  __len = (socklen_t)(dVar7 * (double)iVar2);
  local_40.wd.m_i = iVar1;
  local_40.ht.m_i = __len;
  if ((int)this->updateBehavior < 1) {
    QPaintDeviceWindowPrivate::markWindowAsDirty(&this->super_QPaintDeviceWindowPrivate);
  }
  else {
    pQVar4 = (this->fbo).d;
    if (((pQVar4 == (QOpenGLFramebufferObject *)0x0) ||
        (QVar3 = QOpenGLFramebufferObject::size(pQVar4), iVar1 != QVar3.wd.m_i.m_i)) ||
       (__len != QVar3.ht.m_i.m_i)) {
      fboFormat.d = (QOpenGLFramebufferObjectFormatPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QOpenGLFramebufferObjectFormat::QOpenGLFramebufferObjectFormat(&fboFormat);
      QOpenGLFramebufferObjectFormat::setAttachment(&fboFormat,CombinedDepthStencil);
      QWindow::requestedFormat();
      iVar2 = QSurfaceFormat::samples();
      QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_68);
      if (0 < iVar2) {
        if (this->updateBehavior == PartialUpdateBlend) {
          local_68.wd.m_i = 2;
          local_54 = 0;
          local_68.ht.m_i = 0;
          auStack_60 = SUB1612((undefined1  [16])0x0,4);
          local_50 = "default";
          QMessageLogger::warning
                    ((char *)&local_68,
                     "QOpenGLWindow: PartialUpdateBlend does not support multisampling");
        }
        else {
          QOpenGLFramebufferObjectFormat::setSamples(&fboFormat,iVar2);
        }
      }
      pQVar4 = (QOpenGLFramebufferObject *)operator_new(0x10);
      QOpenGLFramebufferObject::QOpenGLFramebufferObject(pQVar4,&local_40,&fboFormat);
      QScopedPointer<QOpenGLFramebufferObject,_QScopedPointerDeleter<QOpenGLFramebufferObject>_>::
      reset(&this->fbo,pQVar4);
      QPaintDeviceWindowPrivate::markWindowAsDirty(&this->super_QPaintDeviceWindowPrivate);
      QOpenGLFramebufferObjectFormat::~QOpenGLFramebufferObjectFormat(&fboFormat);
    }
  }
  local_68.wd.m_i = iVar1;
  local_68.ht.m_i = __len;
  QOpenGLPaintDevice::setSize(&((this->paintDevice).d)->super_QOpenGLPaintDevice,&local_68);
  this_01 = (this->paintDevice).d;
  devicePixelRatio = (qreal)QWindow::devicePixelRatio();
  QOpenGLPaintDevice::setDevicePixelRatio(&this_01->super_QOpenGLPaintDevice,devicePixelRatio);
  plVar5 = (long *)QOpenGLContext::functions();
  (**(code **)(*plVar5 + 0x170))(0,0,iVar1);
  this_02 = (QOpenGLFunctions *)QOpenGLContext::functions();
  framebuffer = QOpenGLContext::defaultFramebufferObject();
  iVar1 = 0x8d40;
  QOpenGLFunctions::glBindFramebuffer(this_02,0x8d40,framebuffer);
  (**(code **)(*(long *)this_00 + 0x150))(this_00);
  if (0 < (int)this->updateBehavior) {
    QOpenGLFramebufferObject::bind((this->fbo).d,iVar1,__addr,__len);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLWindowPrivate::beginPaint(const QRegion &region)
{
    Q_UNUSED(region);
    Q_Q(QOpenGLWindow);

    initialize();
    context->makeCurrent(q);

    const int deviceWidth = q->width() * q->devicePixelRatio();
    const int deviceHeight = q->height() * q->devicePixelRatio();
    const QSize deviceSize(deviceWidth, deviceHeight);
    if (updateBehavior > QOpenGLWindow::NoPartialUpdate) {
        if (!fbo || fbo->size() != deviceSize) {
            QOpenGLFramebufferObjectFormat fboFormat;
            fboFormat.setAttachment(QOpenGLFramebufferObject::CombinedDepthStencil);
            const int samples = q->requestedFormat().samples();
            if (samples > 0) {
                if (updateBehavior != QOpenGLWindow::PartialUpdateBlend)
                    fboFormat.setSamples(samples);
                else
                    qWarning("QOpenGLWindow: PartialUpdateBlend does not support multisampling");
            }
            fbo.reset(new QOpenGLFramebufferObject(deviceSize, fboFormat));
            markWindowAsDirty();
        }
    } else {
        markWindowAsDirty();
    }

    paintDevice->setSize(QSize(deviceWidth, deviceHeight));
    paintDevice->setDevicePixelRatio(q->devicePixelRatio());
    context->functions()->glViewport(0, 0, deviceWidth, deviceHeight);

    context->functions()->glBindFramebuffer(GL_FRAMEBUFFER, context->defaultFramebufferObject());

    q->paintUnderGL();

    if (updateBehavior > QOpenGLWindow::NoPartialUpdate)
        fbo->bind();
}